

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O3

void __thiscall dtc::fdt::property_value::resolve_type(property_value *this)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  value_type vVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  byte *pbVar9;
  int iVar10;
  
  if (this->type != UNKNOWN) {
    return;
  }
  pbVar9 = (this->byte_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->byte_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pbVar9 == pbVar2) {
    vVar4 = STRING;
  }
  else {
    vVar4 = BINARY;
    if (pbVar2[-1] == 0) {
      iVar7 = (int)pbVar2;
      iVar8 = (int)pbVar9;
      iVar10 = 0;
      bVar3 = true;
      bVar6 = false;
      do {
        bVar1 = *pbVar9;
        if (bVar1 == 0) {
          if ((bVar6) || (!bVar3)) goto LAB_00120a26;
          iVar10 = iVar10 + 1;
          bVar3 = true;
        }
        else {
          iVar5 = isprint((uint)bVar1);
          if (iVar5 == 0) {
            bVar3 = false;
          }
          if (!bVar3) {
LAB_00120a26:
            vVar4 = BINARY;
            goto LAB_00120a42;
          }
        }
        pbVar9 = pbVar9 + 1;
        bVar6 = bVar1 == 0;
      } while (pbVar9 != pbVar2);
      if (bVar3) {
        vVar4 = BINARY;
        if (iVar7 != iVar8 && iVar7 - iVar8 <= iVar10) goto LAB_00120a42;
      }
      else {
        vVar4 = BINARY;
        if (iVar7 != iVar8) goto LAB_00120a42;
      }
      vVar4 = (value_type)(iVar10 < 2);
    }
  }
LAB_00120a42:
  this->type = vVar4;
  return;
}

Assistant:

void
property_value::resolve_type()
{
	if (type != UNKNOWN)
	{
		return;
	}
	if (byte_data.empty())
	{
		type = STRING;
		return;
	}
	if (byte_data.back() == 0)
	{
		bool is_all_printable = true;
		int nuls = 0;
		int bytes = 0;
		bool lastWasNull = false;
		for (auto i : byte_data)
		{
			bytes++;
			is_all_printable &= (i == '\0') || isprint(i);
			if (i == '\0')
			{
				// If there are two nulls in a row, then we're probably binary.
				if (lastWasNull)
				{
					type = BINARY;
					return;
				}
				nuls++;
				lastWasNull = true;
			}
			else
			{
				lastWasNull = false;
			}
			if (!is_all_printable)
			{
				break;
			}
		}
		if ((is_all_printable && (bytes > nuls)) || bytes == 0)
		{
			type = STRING;
			if (nuls > 1)
			{
				type = STRING_LIST;
			}
			return;
		}
	}
	type = BINARY;
}